

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O3

Gia_Man_t *
Gia_PolynCoreDupTree
          (Gia_Man_t *p,Vec_Int_t *vAddCos,Vec_Int_t *vLeaves,Vec_Int_t *vNodes,int fAddCones)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Vec_Int_t *pVVar8;
  Gia_Obj_t *pGVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCo.c"
                  ,0x15d,
                  "Gia_Man_t *Gia_PolynCoreDupTree(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pName = pcVar7;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pSpec = pcVar7;
  p->pObjs->Value = 0;
  if (fAddCones == 0) {
    if (0 < vLeaves->nSize) {
      lVar11 = 0;
      do {
        iVar1 = vLeaves->pArray[lVar11];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0066e4fb;
        pGVar3 = p->pObjs;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        pGVar9 = Gia_ManAppendObj(p_00);
        uVar10 = *(ulong *)pGVar9;
        *(ulong *)pGVar9 = uVar10 | 0x9fffffff;
        *(ulong *)pGVar9 =
             uVar10 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = p_00->pObjs;
        if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) goto LAB_0066e51a;
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555);
        pGVar4 = p_00->pObjs;
        if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) goto LAB_0066e51a;
        pGVar3[iVar1].Value = (int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * 0x55555556;
        lVar11 = lVar11 + 1;
      } while (lVar11 < vLeaves->nSize);
    }
  }
  else {
    pVVar8 = p->vCis;
    uVar10 = (ulong)(uint)pVVar8->nSize;
    if (p->nRegs < pVVar8->nSize) {
      lVar11 = 0;
      do {
        if ((int)uVar10 <= lVar11) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = pVVar8->pArray[lVar11];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0066e4fb;
        pGVar3 = p->pObjs;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        pGVar9 = Gia_ManAppendObj(p_00);
        uVar10 = *(ulong *)pGVar9;
        *(ulong *)pGVar9 = uVar10 | 0x9fffffff;
        *(ulong *)pGVar9 =
             uVar10 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = p_00->pObjs;
        if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) {
LAB_0066e51a:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555);
        pGVar4 = p_00->pObjs;
        if ((pGVar9 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar9)) goto LAB_0066e51a;
        pGVar3[iVar1].Value = (int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * 0x55555556;
        lVar11 = lVar11 + 1;
        pVVar8 = p->vCis;
        uVar10 = (ulong)pVVar8->nSize;
      } while (lVar11 < (long)(uVar10 - (long)p->nRegs));
    }
    if (0 < vLeaves->nSize) {
      lVar11 = 0;
      do {
        iVar1 = vLeaves->pArray[lVar11];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0066e4fb;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar3 = p->pObjs + iVar1;
        uVar5 = Gia_PolynCoreDupTreePlus_rec(p_00,p,pGVar3);
        pGVar3->Value = uVar5;
        lVar11 = lVar11 + 1;
      } while (lVar11 < vLeaves->nSize);
    }
  }
  if (0 < vNodes->nSize) {
    lVar11 = 0;
    do {
      iVar1 = vNodes->pArray[lVar11];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0066e4fb;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar1;
      uVar10 = *(ulong *)pGVar3;
      if ((int)pGVar3[-(ulong)((uint)uVar10 & 0x1fffffff)].Value < 0) goto LAB_0066e539;
      uVar5 = (uint)(uVar10 >> 0x20);
      if ((int)pGVar3[-(ulong)(uVar5 & 0x1fffffff)].Value < 0) goto LAB_0066e539;
      uVar5 = Gia_ManAppendAnd(p_00,(uint)(uVar10 >> 0x1d) & 1 ^
                                    pGVar3[-(ulong)((uint)uVar10 & 0x1fffffff)].Value,
                               pGVar3[-(ulong)(uVar5 & 0x1fffffff)].Value ^ uVar5 >> 0x1d & 1);
      pGVar3->Value = uVar5;
      lVar11 = lVar11 + 1;
    } while (lVar11 < vNodes->nSize);
  }
  pVVar8 = p->vCos;
  if (0 < pVVar8->nSize) {
    lVar11 = 0;
    do {
      iVar1 = pVVar8->pArray[lVar11];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0066e4fb;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar1;
      uVar12 = (uint)*(undefined8 *)pGVar3;
      uVar5 = pGVar3[-(ulong)(uVar12 & 0x1fffffff)].Value;
      if ((int)uVar5 < 0) {
LAB_0066e539:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p_00,uVar12 >> 0x1d & 1 ^ uVar5);
      lVar11 = lVar11 + 1;
      pVVar8 = p->vCos;
    } while (lVar11 < pVVar8->nSize);
  }
  if (0 < vAddCos->nSize) {
    lVar11 = 0;
    do {
      iVar1 = vAddCos->pArray[lVar11];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_0066e4fb:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return p_00;
      }
      Gia_ManAppendCo(p_00,p->pObjs[iVar1].Value);
      lVar11 = lVar11 + 1;
    } while (lVar11 < vAddCos->nSize);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_PolynCoreDupTree( Gia_Man_t * p, Vec_Int_t * vAddCos, Vec_Int_t * vLeaves, Vec_Int_t * vNodes, int fAddCones )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManRegNum(p) == 0 );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    if ( fAddCones )
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi(pNew);
        Gia_ManForEachObjVec( vLeaves, p, pObj, i )
            pObj->Value = Gia_PolynCoreDupTreePlus_rec( pNew, p, pObj );
    }
    else
    {
        Gia_ManForEachObjVec( vLeaves, p, pObj, i )
            pObj->Value = Gia_ManAppendCi(pNew);
    }
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachObjVec( vAddCos, p, pObj, i )
        Gia_ManAppendCo( pNew, pObj->Value );
    return pNew;

}